

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineRecord2.cpp
# Opt level: O1

KDataStream * __thiscall
KDIS::DATA_TYPE::LineRecord2::Encode(KDataStream *__return_storage_ptr__,LineRecord2 *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  LineRecord1::Encode(&this->super_LineRecord1,__return_storage_ptr__);
  (*(this->m_StartVel).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_StartVel,__return_storage_ptr__);
  (*(this->m_EndVel).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EndVel,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LineRecord2::Encode() const
{
    KDataStream stream;

    LineRecord2::Encode( stream );

    return stream;
}